

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O3

Path<SimpleState_*> * __thiscall
xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Path<SimpleState_*> *__return_storage_ptr__,AStar *this,
          Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal,
          CalcHeuristicFunc_t<SimpleState_*,_double> *calc_heuristic)

{
  pointer *pppSVar1;
  undefined8 *puVar2;
  long lVar3;
  SimpleState **__args;
  iterator __position;
  iterator graph_00;
  GetNeighbourFunc_t<SimpleState_*,_double> *get_neighbours;
  iterator start_vtx;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  *__range3;
  undefined4 in_register_00000084;
  vertex_iterator *wp;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  GetNeighbourFunc_t<SimpleState_*,_double> *pGVar4;
  GetNeighbourFunc_t<SimpleState_*,_double> *local_90;
  _Any_data local_78;
  code *local_68;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  for (puVar2 = *(undefined8 **)(this + 0x18); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    lVar3 = puVar2[2];
    *(undefined2 *)(lVar3 + 0x48) = 0;
    *(undefined8 *)(lVar3 + 0x68) = 0;
    *(undefined8 *)(lVar3 + 0x50) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x58) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x60) = 0x7fefffffffffffff;
  }
  graph_00 = std::
             _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(this + 8),(key_type *)&stack0xffffffffffffff68);
  get_neighbours = (GetNeighbourFunc_t<SimpleState_*,_double> *)(long)start;
  start_vtx = std::
              _Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<long,_std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_std::allocator<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(this + 8),(key_type *)&stack0xffffffffffffff68);
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (start_vtx.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0 &&
      graph_00.
      super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
      ._M_cur != (__node_type *)0x0) {
    std::function<double_(SimpleState_*,_SimpleState_*)>::function
              ((function<double_(SimpleState_*,_SimpleState_*)> *)&local_78,
               (function<double_(SimpleState_*,_SimpleState_*)> *)
               CONCAT44(in_register_00000084,goal));
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              ((vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                *)&stack0xffffffffffffff68,this,
               (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)
               graph_00.
               super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
               ._M_cur,(vertex_iterator)
                       start_vtx.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                       ._M_cur,(vertex_iterator)&local_78,
               (CalcHeuristicFunc_t<SimpleState_*,_double> *)&local_58,get_neighbours);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    pGVar4 = get_neighbours;
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
      pGVar4 = get_neighbours;
    }
    for (; get_neighbours != local_90;
        get_neighbours =
             (GetNeighbourFunc_t<SimpleState_*,_double> *)
             ((long)&(get_neighbours->super__Function_base)._M_functor + 8)) {
      __args = *(SimpleState ***)
                (*(long *)&(get_neighbours->super__Function_base)._M_functor + 0x10);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SimpleState*,std::allocator<SimpleState*>>::
        _M_realloc_insert<SimpleState*const&>
                  ((vector<SimpleState*,std::allocator<SimpleState*>> *)__return_storage_ptr__,
                   __position,__args);
      }
      else {
        *__position._M_current = *__args;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    if (pGVar4 != (GetNeighbourFunc_t<SimpleState_*,_double> *)0x0) {
      operator_delete(pGVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Path<State> Search(
      Graph<State, Transition, StateIndexer> *graph, VertexIdentifier start,
      VertexIdentifier goal,
      CalcHeuristicFunc_t<State, Transition> calc_heuristic) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it, calc_heuristic);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }